

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

int glu::TextureTestUtil::computeTextureCompareDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,TextureCubeView *src,float *texCoord,
              ReferenceParams *sampleParams,TexComparePrecision *comparePrec,LodPrecision *lodPrec,
              Vec3 *nonShadowThreshold)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  undefined1 auVar5 [12];
  ulong uVar6;
  undefined1 auVar7 [16];
  ReferenceParams *pRVar8;
  bool bVar9;
  int i;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int faceSize;
  ConstPixelBufferAccess *pCVar13;
  int iVar14;
  float fVar15;
  float fVar17;
  undefined1 auVar16 [16];
  float fVar18;
  float fVar19;
  float fVar22;
  undefined1 auVar20 [16];
  undefined8 uVar23;
  undefined1 auVar21 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  uint uVar28;
  uint uVar31;
  undefined1 auVar29 [16];
  float fVar32;
  undefined1 auVar30 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  float fVar71;
  Vector<float,_3> res;
  Vector<bool,_3> res_2;
  Vector<float,_3> res_1;
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  Vec2 lodBounds;
  Vec4 resPix;
  Vec4 refPix;
  Vec2 lodO;
  int local_39c;
  Vec3 local_388;
  ConstPixelBufferAccess *local_378;
  undefined8 local_370;
  float local_368;
  ReferenceParams *local_360;
  Vec3 local_358;
  undefined1 local_348 [16];
  PixelBufferAccess *local_330;
  Vec4 local_328;
  Vec3 local_318;
  Vec3 local_308;
  float local_2f8;
  float local_2f4;
  float local_2f0;
  float local_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8 [8];
  float local_2b8 [8];
  float local_298 [8];
  ulong local_278;
  ulong local_270;
  undefined1 local_268 [20];
  float fStack_254;
  int iStack_250;
  int iStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [48];
  undefined1 local_1f8 [16];
  Sampler *local_1e8;
  TextureCubeView *local_1e0;
  ConstPixelBufferAccess *local_1d8;
  tcu local_1d0 [8];
  float local_1c8 [4];
  undefined8 local_1b8;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  float local_148;
  float fStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined8 local_58 [5];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  
  local_298[0] = *texCoord;
  local_2b8[0] = texCoord[1];
  local_298[1] = texCoord[3];
  local_298[2] = texCoord[6];
  local_298[3] = texCoord[9];
  local_2b8[1] = texCoord[4];
  local_2b8[2] = texCoord[7];
  local_2b8[3] = texCoord[10];
  local_2d8[0] = texCoord[2];
  local_2d8[1] = texCoord[5];
  local_2d8[2] = texCoord[8];
  local_2d8[3] = texCoord[0xb];
  if (src->m_numLevels < 1) {
    faceSize = 0;
  }
  else {
    faceSize = (src->m_levels[0]->m_size).m_data[0];
  }
  local_348._0_8_ = *(undefined8 *)(result->m_size).m_data;
  fVar71 = (float)((ulong)local_348._0_8_ >> 0x20);
  local_348._8_8_ = 0;
  local_1c8[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_1c8[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_1c8[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_1c8[3] = (sampleParams->super_RenderParams).w.m_data[3];
  local_1b8 = CONCAT44(local_1c8[1],local_1c8[2]);
  stack0xfffffffffffffda8 = ZEXT816(0);
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    register0x00001200 = ZEXT416((uint)(sampleParams->super_RenderParams).bias);
  }
  local_58[0] = 0xbf800000;
  local_58[1] = 0x3f800000;
  local_58[2] = 0xbf80000000000000;
  local_58[3] = 0x3f80000000000000;
  local_228._0_4_ = -1.7146522e+38;
  local_378 = result;
  local_360 = sampleParams;
  local_330 = errorMask;
  local_2d8[4] = local_2d8[2];
  local_2d8[5] = local_2d8[1];
  local_2b8[4] = local_2b8[2];
  local_2b8[5] = local_2b8[1];
  local_298[4] = local_298[2];
  local_298[5] = local_298[1];
  local_1d8 = reference;
  tcu::RGBA::toVec((RGBA *)local_228);
  tcu::clear(local_330,(Vec4 *)local_268);
  iVar14 = (local_378->m_size).m_data[1];
  if (iVar14 < 1) {
    uVar12 = 0;
  }
  else {
    local_228._32_4_ = (float)(int)local_348._0_4_;
    local_228._36_4_ = (float)(int)local_348._4_4_;
    local_228._40_4_ = (float)(int)local_348._8_4_;
    local_228._44_4_ = (float)(int)local_348._12_4_;
    local_1e8 = &local_360->sampler;
    iVar11 = (local_378->m_size).m_data[0];
    auVar36._4_4_ = local_228._36_4_;
    auVar36._0_4_ = local_228._36_4_;
    auVar36._8_4_ = local_228._36_4_;
    auVar36._12_4_ = local_228._36_4_;
    fStack_254 = (float)local_268._16_4_;
    iStack_250 = local_268._16_4_;
    iStack_24c = local_268._16_4_;
    uVar12 = 0;
    local_39c = 0;
    pCVar13 = local_378;
    local_348 = auVar36;
    local_1e0 = src;
    do {
      if (0 < iVar11) {
        fVar15 = (float)local_39c + 0.5;
        local_1a8 = ZEXT416((uint)fVar15);
        fVar27 = fVar15 / auVar36._0_4_;
        local_158 = ZEXT416((uint)fVar27);
        local_168._4_12_ = auVar36._4_12_;
        local_168._0_4_ = auVar36._0_4_ - fVar15;
        local_178 = ZEXT416((uint)(1.0 - fVar27));
        iVar14 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_268,(int)pCVar13,iVar14,local_39c);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_228,(int)local_1d8,iVar14,local_39c);
          local_308.m_data[0] = (float)local_228._4_4_;
          local_308.m_data[1] = (float)local_228._8_4_;
          local_308.m_data[2] = (float)local_228._12_4_;
          local_318.m_data[0] = (float)local_268._4_4_;
          local_318.m_data[1] = (float)local_268._8_4_;
          local_318.m_data[2] = (float)local_268._12_4_;
          local_388.m_data[0] = 0.0;
          local_388.m_data[1] = 0.0;
          local_388.m_data[2] = 0.0;
          lVar10 = 0;
          do {
            local_388.m_data[lVar10] = local_308.m_data[lVar10] - local_318.m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_328.m_data[2] = 0.0;
          local_328.m_data[0] = 0.0;
          local_328.m_data[1] = 0.0;
          lVar10 = 0;
          do {
            fVar15 = local_388.m_data[lVar10];
            auVar66._0_4_ = -fVar15;
            auVar66._4_4_ = 0x80000000;
            auVar66._8_4_ = 0x80000000;
            auVar66._12_4_ = 0x80000000;
            if (auVar66._0_4_ <= fVar15) {
              auVar66._0_4_ = fVar15;
            }
            local_328.m_data[lVar10] = auVar66._0_4_;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          local_370 = local_370 & 0xffffffffff000000;
          lVar10 = 0;
          do {
            *(bool *)((long)&local_370 + lVar10) =
                 local_328.m_data[lVar10] <= nonShadowThreshold->m_data[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          if (((local_370._0_1_ == (tcu)0x0) || (local_370._1_1_ == '\0')) ||
             (local_370._2_1_ == '\0')) {
            local_388.m_data[0] = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)&local_388);
            tcu::PixelBufferAccess::setPixel(local_330,&local_328,iVar14,local_39c,0);
            uVar12 = (ulong)((int)uVar12 + 1);
          }
          else if (((float)local_268._0_4_ != (float)local_228._0_4_) ||
                  (NAN((float)local_268._0_4_) || NAN((float)local_228._0_4_))) {
            fVar70 = (float)iVar14 + 0.5;
            fVar33 = local_228._32_4_;
            fVar27 = fVar70 / fVar33;
            bVar9 = 1.0 <= (float)local_158._0_4_ + fVar27;
            auVar51._4_12_ = local_228._36_12_;
            uVar31 = (uint)bVar9;
            uVar28 = (int)(uVar31 << 0x1f) >> 0x1f;
            uVar31 = (int)(uVar31 << 0x1f) >> 0x1f;
            local_68 = (float)((uint)(fVar33 - fVar70) & uVar28 | ~uVar28 & (uint)fVar70);
            fStack_64 = (float)(local_168._0_4_ & uVar31 | ~uVar31 & local_1a8._0_4_);
            fStack_5c = (float)local_1a8._4_4_;
            uVar6 = (ulong)bVar9;
            uVar4 = *(ulong *)(local_1c8 + uVar6 * 3);
            auVar68._8_8_ = 0;
            auVar68._0_8_ = uVar4;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = *(ulong *)(local_1c8 + uVar6 * 3 + 1);
            local_188 = (float)uVar4;
            local_f8._4_4_ = (float)(uVar4 >> 0x20);
            fVar15 = local_1c8[uVar6 * 3 + 2];
            auVar25._0_4_ = local_178._0_4_ & uVar28;
            auVar25._4_4_ = (uint)(1.0 - fVar27) & uVar31;
            auVar25._8_8_ = 0;
            auVar29._0_4_ = ~uVar28 & local_158._0_4_;
            auVar29._4_4_ = ~uVar31 & (uint)fVar27;
            auVar29._8_4_ = local_158._8_4_;
            auVar29._12_4_ = local_158._12_4_;
            auVar29 = auVar29 | auVar25;
            fVar18 = auVar29._0_4_;
            fVar32 = auVar29._4_4_;
            fVar24 = (1.0 - fVar32) - fVar18;
            auVar36 = divps(auVar29,auVar50);
            auVar37._4_4_ = auVar36._4_4_;
            auVar37._0_4_ = auVar37._4_4_;
            auVar37._8_4_ = auVar37._4_4_;
            auVar37._12_4_ = auVar37._4_4_;
            auVar38._4_12_ = auVar37._4_12_;
            auVar38._0_4_ = auVar37._4_4_ + fVar24 / local_188 + auVar36._0_4_;
            fVar27 = local_2d8[uVar6 * 3];
            fVar1 = local_2d8[uVar6 * 3 + 1];
            fVar2 = local_2d8[uVar6 * 3 + 2];
            fVar17 = local_2b8[uVar6 * 3 + 1];
            local_248 = ZEXT416((uint)fVar17);
            fVar19 = local_2b8[uVar6 * 3 + 2];
            fVar22 = local_298[uVar6 * 3 + 2];
            fVar35 = local_298[uVar6 * 3];
            _local_238 = ZEXT416((uint)fVar35);
            auVar62._0_4_ = fVar35 * fVar24;
            auVar62._4_4_ = fVar17 * fVar18;
            auVar62._8_4_ = auVar29._8_4_ * 0.0;
            auVar62._12_4_ = auVar29._12_4_ * 0.0;
            local_88._4_4_ = local_188;
            local_88._0_4_ = local_f8._4_4_;
            local_88._8_8_ = 0;
            fVar61 = local_2b8[uVar6 * 3];
            fVar3 = local_298[uVar6 * 3 + 1];
            local_98 = CONCAT44(fVar61,fVar3);
            uStack_90 = 0;
            auVar65._0_4_ = fVar18 * fVar3;
            auVar65._4_4_ = fVar24 * fVar61;
            auVar65._8_4_ = auVar29._8_4_ * 0.0;
            auVar65._12_4_ = auVar29._12_4_ * 0.0;
            auVar66 = divps(auVar65,local_88);
            auVar36 = divps(auVar62,auVar68);
            auVar67._0_4_ = fVar32 * fVar22;
            auVar67._4_4_ = fVar32 * fVar19;
            auVar67._8_4_ = fVar32 * 0.0;
            auVar67._12_4_ = fVar32 * 0.0;
            local_198._4_4_ = fVar15;
            local_198._0_4_ = fVar15;
            local_198._8_4_ = fVar15;
            local_198._12_4_ = fVar15;
            auVar68 = divps(auVar67,local_198);
            auVar69._0_4_ = auVar68._0_4_ + auVar36._0_4_ + auVar66._0_4_;
            auVar69._4_4_ = auVar68._4_4_ + auVar36._4_4_ + auVar66._4_4_;
            auVar69._8_4_ = auVar68._8_4_ + auVar36._8_4_ + auVar66._8_4_;
            auVar69._12_4_ = auVar68._12_4_ + auVar36._12_4_ + auVar66._12_4_;
            local_388.m_data[2] =
                 ((fVar32 * fVar2) / fVar15 +
                 (fVar18 * fVar1) / local_f8._4_4_ + (fVar24 * fVar27) / local_188) / auVar38._0_4_;
            auVar40._0_8_ = auVar38._0_8_;
            auVar40._8_4_ = auVar37._4_4_;
            auVar40._12_4_ = auVar37._4_4_;
            auVar39._8_8_ = auVar40._8_8_;
            auVar39._4_4_ = auVar38._0_4_;
            auVar39._0_4_ = auVar38._0_4_;
            auVar36 = divps(auVar69,auVar39);
            local_388.m_data._0_8_ = auVar36._0_8_;
            fVar34 = fVar18 + -1.0;
            local_a8 = ZEXT416((uint)(fVar15 * fVar33));
            local_b8 = local_f8._4_4_ * fVar15;
            fVar70 = (fVar33 * fVar34 + fVar70) * local_b8 -
                     (fVar15 * fVar33 * fVar18 + fVar70 * local_f8._4_4_) * local_188;
            local_c8 = (fVar3 - fVar35) * fVar15 + (fVar22 - fVar3) * local_188;
            fStack_c4 = (fVar17 - fVar61) * fVar15 + (fVar19 - fVar17) * local_188;
            fStack_c0 = fVar15 * 0.0 + local_188 * 0.0;
            fStack_bc = fVar15 * 0.0 + local_188 * 0.0;
            local_1f8._4_4_ = 0.0;
            local_2ec = (fVar1 - fVar27) * fVar15 + (fVar2 - fVar1) * local_188;
            local_2f0 = (fVar27 - fVar2) * local_f8._4_4_;
            local_d8 = (fVar35 - fVar22) * local_f8._4_4_;
            fStack_d4 = (fVar61 - fVar19) * local_f8._4_4_;
            fStack_d0 = local_f8._4_4_ * 0.0;
            fStack_cc = local_f8._4_4_ * 0.0;
            fVar24 = local_188 * local_f8._4_4_ * fVar15;
            local_f8._0_4_ = fVar24 * fVar33;
            local_f8._8_8_ = 0;
            auVar51._0_4_ = fVar70 * fVar70;
            local_308.m_data[2] =
                 ((local_2f0 * fVar34 + fVar18 * local_2ec) * (float)local_f8._0_4_) / auVar51._0_4_
            ;
            auVar41._0_4_ = (fVar34 * local_d8 + fVar18 * local_c8) * (float)local_f8._0_4_;
            auVar41._4_4_ = (fVar34 * fStack_d4 + fVar18 * fStack_c4) * (float)local_f8._0_4_;
            auVar41._8_4_ = (fVar32 * fStack_d0 + fVar18 * fStack_c0) * (float)local_f8._0_4_;
            auVar41._12_4_ = (fVar32 * fStack_cc + fVar18 * fStack_bc) * (float)local_f8._0_4_;
            auVar53._0_8_ = auVar51._0_8_;
            auVar53._8_4_ = local_228._36_4_;
            auVar53._12_4_ = local_228._36_4_;
            auVar52._8_8_ = auVar53._8_8_;
            auVar52._4_4_ = auVar51._0_4_;
            auVar52._0_4_ = auVar51._0_4_;
            auVar36 = divps(auVar41,auVar52);
            local_308.m_data._0_8_ = auVar36._0_8_;
            fVar34 = local_348._0_4_;
            local_118 = local_f8._4_4_ * fVar34;
            fVar18 = fVar32 + -1.0;
            auVar42._4_12_ = local_348._4_12_;
            fVar33 = (fVar34 * fVar18 + (float)local_1a8._0_4_) * local_b8 -
                     (local_118 * fVar32 + (float)local_1a8._0_4_ * fVar15) * local_188;
            local_78 = CONCAT44(fVar19,fVar22);
            uStack_70 = 0;
            local_128 = (fVar3 - fVar22) * local_188 + (fVar22 - fVar35) * local_f8._4_4_;
            fStack_124 = (fVar17 - fVar19) * local_188 + (fVar19 - fVar61) * local_f8._4_4_;
            fStack_120 = local_188 * 0.0 + local_f8._4_4_ * 0.0;
            fStack_11c = local_188 * 0.0 + local_f8._4_4_ * 0.0;
            fStack_2e4 = local_f8._4_4_;
            local_2e8 = local_f8._4_4_;
            fStack_2e0 = local_f8._4_4_;
            fStack_2dc = local_f8._4_4_;
            uStack_180 = 0;
            uStack_17c = 0;
            local_2f4 = (fVar1 - fVar2) * local_188 + (fVar2 - fVar27) * local_f8._4_4_;
            local_2f8 = (fVar27 - fVar1) * fVar15;
            local_228._16_4_ = (fVar35 - fVar3) * fVar15;
            local_228._20_4_ = (fVar61 - fVar17) * fVar15;
            local_228._24_4_ = fVar15 * 0.0;
            local_228._28_4_ = fVar15 * 0.0;
            local_e8._0_4_ = fVar24 * fVar34;
            local_e8._4_4_ = local_f8._4_4_;
            local_e8._8_8_ = 0;
            auVar42._0_4_ = fVar33 * fVar33;
            local_318.m_data[2] =
                 ((local_2f8 * fVar18 + fVar32 * local_2f4) * (float)local_e8._0_4_) / auVar42._0_4_
            ;
            auVar20._0_4_ =
                 (fVar18 * (float)local_228._16_4_ + fVar32 * local_128) * (float)local_e8._0_4_;
            auVar20._4_4_ =
                 (fVar18 * (float)local_228._20_4_ + fVar32 * fStack_124) * (float)local_e8._0_4_;
            auVar20._8_4_ =
                 (fVar32 * (float)local_228._24_4_ + fVar32 * fStack_120) * (float)local_e8._0_4_;
            auVar20._12_4_ =
                 (fVar32 * (float)local_228._28_4_ + fVar32 * fStack_11c) * (float)local_e8._0_4_;
            auVar44._0_8_ = auVar42._0_8_;
            auVar44._8_4_ = local_348._4_4_;
            auVar44._12_4_ = local_348._4_4_;
            auVar43._8_8_ = auVar44._8_8_;
            auVar43._4_4_ = auVar42._0_4_;
            auVar43._0_4_ = auVar42._0_4_;
            auVar36 = divps(auVar20,auVar43);
            uVar23 = auVar36._8_8_;
            local_318.m_data._0_8_ = auVar36._0_8_;
            local_148 = -local_188;
            fStack_144 = -local_f8._4_4_;
            uStack_140 = 0x80000000;
            uStack_13c = 0x80000000;
            fVar17 = (float)local_1f8._4_4_;
            local_278 = uVar12;
            local_1f8 = ZEXT416((uint)fVar15);
            fStack_184 = local_f8._4_4_;
            local_138 = (float)local_e8._0_4_;
            fStack_134 = (float)local_e8._0_4_;
            fStack_130 = (float)local_e8._0_4_;
            fStack_12c = (float)local_e8._0_4_;
            fStack_114 = local_f8._4_4_;
            fStack_110 = local_f8._4_4_;
            fStack_10c = local_f8._4_4_;
            local_108 = (float)local_f8._0_4_;
            fStack_104 = (float)local_f8._0_4_;
            fStack_100 = (float)local_f8._0_4_;
            fStack_fc = (float)local_f8._0_4_;
            fStack_b4 = local_f8._4_4_;
            fStack_b0 = local_f8._4_4_;
            fStack_ac = local_f8._4_4_;
            fStack_60 = fVar71;
            tcu::computeCubeLodBoundsFromDerivates
                      ((tcu *)&local_270,&local_388,&local_308,&local_318,faceSize,lodPrec);
            fStack_230 = (float)local_238._4_4_;
            local_238._4_4_ = local_248._0_4_;
            fStack_22c = (float)local_248._4_4_;
            auVar5._4_8_ = uVar23;
            auVar5._0_4_ = fStack_184;
            auVar21._0_8_ = auVar5._0_8_ << 0x20;
            auVar21._8_4_ = uStack_180;
            auVar21._12_4_ = uStack_17c;
            local_248._4_12_ = auVar21._4_12_;
            local_248._0_4_ = local_1f8._0_4_;
            lVar10 = 0;
            fVar71 = fVar17;
            do {
              fVar19 = (float)local_58[lVar10] + local_68;
              fVar22 = (float)((ulong)local_58[lVar10] >> 0x20) + fStack_64;
              auVar16._4_4_ = fVar22;
              auVar16._0_4_ = fVar19;
              auVar16._8_4_ = fStack_60 + 0.0;
              auVar16._12_4_ = fStack_5c + 0.0;
              auVar36 = divps(auVar16,local_228._32_16_);
              fVar15 = auVar36._0_4_;
              fVar17 = auVar36._4_4_;
              fVar35 = (1.0 - fVar15) - fVar17;
              auVar7._4_4_ = fStack_184;
              auVar7._0_4_ = local_188;
              auVar7._8_4_ = uStack_180;
              auVar7._12_4_ = uStack_17c;
              auVar36 = divps(auVar36,local_248);
              fVar61 = auVar36._4_4_;
              auVar54._4_4_ = fVar61;
              auVar54._0_4_ = fVar61;
              auVar54._8_4_ = fVar61;
              auVar54._12_4_ = fVar61;
              auVar55._4_12_ = auVar54._4_12_;
              auVar55._0_4_ = fVar61 + fVar35 / local_188 + auVar36._0_4_;
              local_328.m_data[2] =
                   ((fVar2 * fVar15) / (float)local_1f8._0_4_ +
                   (fVar1 * fVar17) / local_2e8 + (fVar27 * fVar35) / local_188) / auVar55._0_4_;
              auVar26._0_4_ = fVar17 * (float)local_98;
              auVar26._4_4_ = fVar35 * local_98._4_4_;
              auVar26._8_4_ = fVar17 * (float)uStack_90;
              auVar26._12_4_ = fVar17 * uStack_90._4_4_;
              auVar36 = divps(auVar26,local_88);
              auVar45._0_4_ = fVar35 * (float)local_238._0_4_;
              auVar45._4_4_ = fVar17 * (float)local_238._4_4_;
              auVar45._8_4_ = fVar17 * fStack_230;
              auVar45._12_4_ = fVar17 * fStack_22c;
              auVar66 = divps(auVar45,auVar7);
              auVar63._0_4_ = (float)local_78 * fVar15;
              auVar63._4_4_ = local_78._4_4_ * fVar15;
              auVar63._8_4_ = (float)uStack_70 * fVar15;
              auVar63._12_4_ = uStack_70._4_4_ * fVar15;
              auVar68 = divps(auVar63,local_198);
              auVar64._0_4_ = auVar68._0_4_ + auVar66._0_4_ + auVar36._0_4_;
              auVar64._4_4_ = auVar68._4_4_ + auVar66._4_4_ + auVar36._4_4_;
              auVar64._8_4_ = auVar68._8_4_ + auVar66._8_4_ + auVar36._8_4_;
              auVar64._12_4_ = auVar68._12_4_ + auVar66._12_4_ + auVar36._12_4_;
              auVar57._0_8_ = auVar55._0_8_;
              auVar57._8_4_ = fVar61;
              auVar57._12_4_ = fVar61;
              auVar56._8_8_ = auVar57._8_8_;
              auVar56._4_4_ = auVar55._0_4_;
              auVar56._0_4_ = auVar55._0_4_;
              auVar36 = divps(auVar64,auVar56);
              local_328.m_data._0_8_ = auVar36._0_8_;
              fVar35 = fVar17 + -1.0;
              auVar58._4_12_ = local_228._36_12_;
              fVar19 = (local_228._32_4_ * fVar35 + fVar19) * local_b8 +
                       ((float)local_a8._0_4_ * fVar17 + local_2e8 * fVar19) * local_148;
              auVar58._0_4_ = fVar19 * fVar19;
              local_368 = ((local_2f0 * fVar35 + local_2ec * fVar17) * (float)local_f8._0_4_) /
                          auVar58._0_4_;
              auVar46._0_4_ = (fVar35 * local_d8 + fVar17 * local_c8) * local_108;
              auVar46._4_4_ = (fVar35 * fStack_d4 + fVar17 * fStack_c4) * fStack_104;
              auVar46._8_4_ = (fVar17 * fStack_d0 + fVar17 * fStack_c0) * fStack_100;
              auVar46._12_4_ = (fVar17 * fStack_cc + fVar17 * fStack_bc) * fStack_fc;
              auVar60._0_8_ = auVar58._0_8_;
              auVar60._8_4_ = local_228._36_4_;
              auVar60._12_4_ = local_228._36_4_;
              auVar59._8_8_ = auVar60._8_8_;
              auVar59._4_4_ = auVar58._0_4_;
              auVar59._0_4_ = auVar58._0_4_;
              auVar36 = divps(auVar46,auVar59);
              local_370 = auVar36._0_8_;
              fVar19 = fVar15 + -1.0;
              auVar47._4_12_ = local_348._4_12_;
              fVar22 = (local_348._0_4_ * fVar19 + fVar22) * local_b8 +
                       (local_118 * fVar15 + fVar22 * (float)local_1f8._0_4_) * local_148;
              auVar47._0_4_ = fVar22 * fVar22;
              local_358.m_data[2] =
                   ((local_2f8 * fVar19 + fVar15 * local_2f4) * (float)local_e8._0_4_) /
                   auVar47._0_4_;
              auVar30._0_4_ = (fVar19 * (float)local_228._16_4_ + fVar15 * local_128) * local_138;
              auVar30._4_4_ = (fVar19 * (float)local_228._20_4_ + fVar15 * fStack_124) * fStack_134;
              auVar30._8_4_ = (fVar17 * (float)local_228._24_4_ + fVar15 * fStack_120) * fStack_130;
              auVar30._12_4_ = (fVar17 * (float)local_228._28_4_ + fVar15 * fStack_11c) * fStack_12c
              ;
              auVar49._0_8_ = auVar47._0_8_;
              auVar49._8_4_ = local_348._4_4_;
              auVar49._12_4_ = local_348._4_4_;
              auVar48._8_8_ = auVar49._8_8_;
              auVar48._4_4_ = auVar47._0_4_;
              auVar48._0_4_ = auVar47._0_4_;
              auVar36 = divps(auVar30,auVar48);
              local_358.m_data._0_8_ = auVar36._0_8_;
              tcu::computeCubeLodBoundsFromDerivates
                        (local_1d0,(Vec3 *)&local_328,(Vec3 *)&local_370,&local_358,faceSize,lodPrec
                        );
              pRVar8 = local_360;
              fVar15 = (float)(local_270 >> 0x20);
              uVar31 = -(uint)((float)local_270 <= local_1d0._0_4_);
              uVar28 = -(uint)(local_1d0._4_4_ <= fVar15);
              local_270 = CONCAT44(~uVar28 & (uint)local_1d0._4_4_,~uVar31 & (uint)local_1d0._0_4_)
                          | CONCAT44((uint)fVar15 & uVar28,(uint)(float)local_270 & uVar31);
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            local_328.m_data[0] = (float)local_270 + (float)local_268._16_4_;
            local_328.m_data[1] = (float)(local_270 >> 0x20) + fStack_254;
            local_358.m_data[0] = local_360->minLod;
            local_358.m_data[1] = local_360->maxLod;
            tcu::clampLodBounds((tcu *)&local_370,(Vec2 *)&local_328,(Vec2 *)&local_358,lodPrec);
            bVar9 = tcu::isTexCompareResultValid
                              (local_1e0,local_1e8,comparePrec,&local_388,(Vec2 *)&local_370,
                               (pRVar8->super_RenderParams).ref,(float)local_268._0_4_);
            uVar12 = local_278;
            if (!bVar9) {
              local_358.m_data[0] = -1.7014636e+38;
              tcu::RGBA::toVec((RGBA *)&local_358);
              tcu::PixelBufferAccess::setPixel(local_330,&local_328,iVar14,local_39c,0);
              uVar12 = (ulong)((int)local_278 + 1);
            }
          }
          iVar14 = iVar14 + 1;
          iVar11 = (local_378->m_size).m_data[0];
          pCVar13 = local_378;
        } while (iVar14 < iVar11);
        iVar14 = (local_378->m_size).m_data[1];
        auVar36 = local_348;
      }
      local_39c = local_39c + 1;
    } while (local_39c < iVar14);
  }
  return (int)uVar12;
}

Assistant:

int computeTextureCompareDiff (const tcu::ConstPixelBufferAccess&	result,
							   const tcu::ConstPixelBufferAccess&	reference,
							   const tcu::PixelBufferAccess&		errorMask,
							   const tcu::TextureCubeView&			src,
							   const float*							texCoord,
							   const ReferenceParams&				sampleParams,
							   const tcu::TexComparePrecision&		comparePrec,
							   const tcu::LodPrecision&				lodPrec,
							   const tcu::Vec3&						nonShadowThreshold)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	const tcu::Vec4		sq				= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4		tq				= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4		rq				= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	const tcu::IVec2	dstSize			= tcu::IVec2(result.getWidth(), result.getHeight());
	const float			dstW			= float(dstSize.x());
	const float			dstH			= float(dstSize.y());
	const int			srcSize			= src.getSize();

	// Coordinates per triangle.
	const tcu::Vec3		triS[2]			= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3		triT[2]			= { tq.swizzle(0, 1, 2), tq.swizzle(3, 2, 1) };
	const tcu::Vec3		triR[2]			= { rq.swizzle(0, 1, 2), rq.swizzle(3, 2, 1) };
	const tcu::Vec3		triW[2]			= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2		lodBias			((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int					numFailed		= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= result.getPixel(px, py);
			const tcu::Vec4	refPix	= reference.getPixel(px, py);

			// Other channels should trivially match to reference.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(refPix.swizzle(1,2,3) - resPix.swizzle(1,2,3)), nonShadowThreshold)))
			{
				errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
				numFailed += 1;
				continue;
			}

			// Reference result is known to be a valid result, we can
			// skip verification if thes results are equal
			if (resPix.x() != refPix.x())
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const tcu::Vec3	coord		(projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triT[triNdx], triW[triNdx], triNx, triNy),
											 projectedTriInterpolate(triR[triNdx], triW[triNdx], triNx, triNy));
				const tcu::Vec3	coordDx		(triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy),
											 triDerivateX(triT[triNdx], triW[triNdx], wx, dstW, triNy),
											 triDerivateX(triR[triNdx], triW[triNdx], wx, dstW, triNy));
				const tcu::Vec3	coordDy		(triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx),
											 triDerivateY(triT[triNdx], triW[triNdx], wy, dstH, triNx),
											 triDerivateY(triR[triNdx], triW[triNdx], wy, dstH, triNx));

				tcu::Vec2		lodBounds	= tcu::computeCubeLodBoundsFromDerivates(coord, coordDx, coordDy, srcSize, lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const tcu::Vec3	coordO		(projectedTriInterpolate(triS[triNdx], triW[triNdx], nxo, nyo),
												 projectedTriInterpolate(triT[triNdx], triW[triNdx], nxo, nyo),
												 projectedTriInterpolate(triR[triNdx], triW[triNdx], nxo, nyo));
					const tcu::Vec3	coordDxo	(triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo),
												 triDerivateX(triT[triNdx], triW[triNdx], wxo, dstW, nyo),
												 triDerivateX(triR[triNdx], triW[triNdx], wxo, dstW, nyo));
					const tcu::Vec3	coordDyo	(triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo),
												 triDerivateY(triT[triNdx], triW[triNdx], wyo, dstH, nxo),
												 triDerivateY(triR[triNdx], triW[triNdx], wyo, dstH, nxo));
					const tcu::Vec2	lodO		= tcu::computeCubeLodBoundsFromDerivates(coordO, coordDxo, coordDyo, srcSize, lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isTexCompareResultValid(src, sampleParams.sampler, comparePrec, coord, clampedLod, sampleParams.ref, resPix.x());

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}